

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderInsufficientEmittedVerticesTest::iterate
          (GeometryShaderInsufficientEmittedVerticesTest *this)

{
  GLubyte *pGVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  GLuint *pGVar6;
  undefined4 extraout_var;
  MessageBuilder *pMVar7;
  NotSupportedError *this_00;
  char *description;
  TestContext **ppTVar8;
  long lVar9;
  GLuint i;
  char **sh2_body_parts;
  uint uVar10;
  ulong uVar11;
  bool has_shader_compilation_failed;
  undefined8 local_290;
  TestContext **local_288;
  ulong local_280;
  char *fs_code_specialized_raw;
  char *gs_triangle_strip;
  char *gs_line_strip;
  char *fs_code;
  char *gs_codes_specialized_raw [2];
  char *vs_code_specialized_raw;
  string vs_code_specialized;
  string gs_codes_specialized [2];
  string fs_code_specialized;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  
  fs_code = 
  "${VERSION}\n\nprecision highp float;\n\nout vec4 result;\n\nvoid main()\n{\n    result = vec4(1.0, 0.0, 0.0, 0.0);\n}\n"
  ;
  gs_line_strip =
       "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                       in;\nlayout (line_strip, max_vertices = 2) out;\n\n${IN_PER_VERTEX_DECL}\nvoid main()\n{\n    gl_Position    = gl_in[0].gl_Position;\n    gl_Position.zw = vec2(0.0, 1.0);\n    EmitVertex();\n}\n"
  ;
  gs_triangle_strip =
       "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                           in;\nlayout (triangle_strip, max_vertices = 3) out;\n\n${IN_PER_VERTEX_DECL}\nvoid main()\n{\n    gl_Position    = gl_in[0].gl_Position;\n    gl_Position.zw = vec2(0.0, 1.0);\n    EmitVertex();\n    gl_Position    = gl_in[0].gl_Position;\n    gl_Position.zw = vec2(0.0, 1.0);\n    EmitVertex();\n}\n"
  ;
  has_shader_compilation_failed = true;
  uVar11 = (ulong)this->m_number_of_gs << 2;
  pGVar6 = (GLuint *)operator_new__(uVar11);
  this->m_gs_ids = pGVar6;
  pGVar6 = (GLuint *)operator_new__(uVar11);
  this->m_po_ids = pGVar6;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0xdb2);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar3);
  uVar11 = 0;
  while( true ) {
    if (this->m_number_of_gs <= uVar11) break;
    GVar4 = (**(code **)(lVar9 + 0x3f0))(0x8dd9);
    this->m_gs_ids[uVar11] = GVar4;
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xdbb);
    GVar4 = (**(code **)(lVar9 + 0x3c8))();
    this->m_po_ids[uVar11] = GVar4;
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"glCreateShader() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xdbe);
    uVar11 = uVar11 + 1;
  }
  GVar4 = (**(code **)(lVar9 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar4;
  GVar4 = (**(code **)(lVar9 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar4;
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xdc4);
  TestCaseBase::specializeShader_abi_cxx11_
            (&fs_code_specialized,&this->super_TestCaseBase,1,&fs_code);
  fs_code_specialized_raw = fs_code_specialized._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (gs_codes_specialized,&this->super_TestCaseBase,1,&gs_line_strip);
  TestCaseBase::specializeShader_abi_cxx11_
            (gs_codes_specialized + 1,&this->super_TestCaseBase,1,&gs_triangle_strip);
  gs_codes_specialized_raw[0] = gs_codes_specialized[0]._M_dataplus._M_p;
  gs_codes_specialized_raw[1] = gs_codes_specialized[1]._M_dataplus._M_p;
  local_290 = 1;
  TestCaseBase::specializeShader_abi_cxx11_
            (&vs_code_specialized,&this->super_TestCaseBase,1,&dummy_vs_code);
  vs_code_specialized_raw = vs_code_specialized._M_dataplus._M_p;
  sh2_body_parts = gs_codes_specialized_raw;
  uVar11 = 0;
LAB_00cd4183:
  if (uVar11 < this->m_number_of_gs) goto code_r0x00cd4192;
  pGVar6 = &this->m_texture_id;
  (**(code **)(lVar9 + 0x6f8))(1,pGVar6);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"glGenTextures() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xde5);
  (**(code **)(lVar9 + 0xb8))(0xde1,*pGVar6);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xde8);
  (**(code **)(lVar9 + 0x1380))(0xde1,1,0x8058,0x10,0x10);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"glTexStorage2D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xdec);
  (**(code **)(lVar9 + 0x6d0))(1,&this->m_fbo_id);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"glGenFramebuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xdf0);
  (**(code **)(lVar9 + 0x78))(0x8d40,this->m_fbo_id);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xdf3);
  (**(code **)(lVar9 + 0x6a0))(0x8d40,0x8ce0,0xde1,*pGVar6,0);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"glFramebufferTexture2D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xdf6);
  (**(code **)(lVar9 + 0x708))(1,&this->m_vao_id);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"glGenVertexArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xdfa);
  (**(code **)(lVar9 + 0xd8))(this->m_vao_id);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"glBindVertexArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xdfd);
  (**(code **)(lVar9 + 0x1c0))(0,0x3f800000,0,0);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"glClearColor() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xe00);
  local_288 = &(this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  bVar2 = true;
  uVar11 = 0;
  while (uVar11 < this->m_number_of_gs) {
    local_280 = uVar11;
    (**(code **)(lVar9 + 0x1680))(this->m_po_ids[uVar11]);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xe06);
    (**(code **)(lVar9 + 0x188))(0x4000);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"glClear() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xe09);
    (**(code **)(lVar9 + 0x538))(0,0,1);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"glDrawArrays() call failed for GL_POINTS pname.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xe0c);
    (**(code **)(lVar9 + 0x1220))
              (0,0,this->m_texture_width,this->m_texture_height,0x1908,0x1401,this->m_pixels);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"glReadPixels() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xe0f);
    pGVar1 = this->m_pixels;
    for (uVar10 = 0;
        uVar10 < (this->m_texture_height * this->m_texture_width + -1) *
                 this->m_number_of_color_components;
        uVar10 = uVar10 + this->m_number_of_color_components) {
      if ((((pGVar1[uVar10] != '\0') && (pGVar1[uVar10 + 1] != 0xff)) &&
          (pGVar1[uVar10 + 2] != '\0')) && (pGVar1[uVar10 + 3] != '\0')) {
        local_1b0 = (undefined1  [8])(*local_288)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"Pixel [");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::operator<<(&local_1a8,"] has color = [");
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,this->m_pixels + uVar10);
        std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,this->m_pixels + (uVar10 + 1));
        std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,this->m_pixels + (uVar10 + 2));
        std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,this->m_pixels + (uVar10 + 3));
        std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"] ");
        std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                        "instead of [0, 255, 0, 0].");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        bVar2 = false;
        break;
      }
    }
    uVar11 = local_280 + 1;
  }
  if (bVar2) {
    description = "Pass";
    local_290 = 0;
    ppTVar8 = local_288;
    goto LAB_00cd4742;
  }
  goto LAB_00cd4737;
code_r0x00cd4192:
  bVar2 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_ids[uVar11],this->m_fs_id,1,
                     &fs_code_specialized_raw,this->m_gs_ids[uVar11],1,sh2_body_parts,this->m_vs_id,
                     1,&vs_code_specialized_raw,&has_shader_compilation_failed);
  uVar11 = uVar11 + 1;
  sh2_body_parts = sh2_body_parts + 1;
  if (!bVar2) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<(&local_1a8,"Program object linking failed for i = ");
    std::operator<<(&local_1a8,"[");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::operator<<(&local_1a8,"].");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
LAB_00cd4737:
    description = "Fail";
    ppTVar8 = &(this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
LAB_00cd4742:
    tcu::TestContext::setTestResult(*ppTVar8,(qpTestResult)local_290,description);
    std::__cxx11::string::~string((string *)&vs_code_specialized);
    lVar9 = 0x20;
    do {
      std::__cxx11::string::~string
                ((string *)((long)&gs_codes_specialized[0]._M_dataplus._M_p + lVar9));
      lVar9 = lVar9 + -0x20;
    } while (lVar9 != -0x20);
    std::__cxx11::string::~string((string *)&fs_code_specialized);
    return STOP;
  }
  goto LAB_00cd4183;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderInsufficientEmittedVerticesTest::iterate()
{
	/* Define Fragment Shader for purpose of this test. */
	const char* fs_code = "${VERSION}\n"
						  "\n"
						  "precision highp float;\n"
						  "\n"
						  "out vec4 result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    result = vec4(1.0, 0.0, 0.0, 0.0);\n"
						  "}\n";

	/* Define 2 Geometry Shaders for purpose of this test. */
	const char* gs_line_strip = "${VERSION}\n"
								"${GEOMETRY_SHADER_REQUIRE}\n"
								"\n"
								"layout (points)                       in;\n"
								"layout (line_strip, max_vertices = 2) out;\n"
								"\n"
								"${IN_PER_VERTEX_DECL}"
								"\n"
								"void main()\n"
								"{\n"
								"    gl_Position    = gl_in[0].gl_Position;\n"
								"    gl_Position.zw = vec2(0.0, 1.0);\n"
								"    EmitVertex();\n"
								"}\n";

	const char* gs_triangle_strip = "${VERSION}\n"
									"${GEOMETRY_SHADER_REQUIRE}\n"
									"\n"
									"layout (points)                           in;\n"
									"layout (triangle_strip, max_vertices = 3) out;\n"
									"\n"
									"${IN_PER_VERTEX_DECL}"
									"\n"
									"void main()\n"
									"{\n"
									"    gl_Position    = gl_in[0].gl_Position;\n"
									"    gl_Position.zw = vec2(0.0, 1.0);\n"
									"    EmitVertex();\n"

									"    gl_Position    = gl_in[0].gl_Position;\n"
									"    gl_Position.zw = vec2(0.0, 1.0);\n"
									"    EmitVertex();\n"
									"}\n";

	bool has_shader_compilation_failed = true;
	bool result						   = true;

	m_gs_ids = new glw::GLuint[m_number_of_gs];
	m_po_ids = new glw::GLuint[m_number_of_gs];

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create program objects & geometry shader objects. */
	for (glw::GLuint i = 0; i < m_number_of_gs; ++i)
	{
		m_gs_ids[i] = gl.createShader(GL_GEOMETRY_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

		m_po_ids[i] = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");
	}

	/* Create shader object. */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Try to link the test program object */
	std::string fs_code_specialized		= specializeShader(1, &fs_code);
	const char* fs_code_specialized_raw = fs_code_specialized.c_str();

	std::string gs_codes_specialized[] = { specializeShader(1, &gs_line_strip),
										   specializeShader(1, &gs_triangle_strip) };

	const char* gs_codes_specialized_raw[] = { gs_codes_specialized[0].c_str(), gs_codes_specialized[1].c_str() };

	std::string vs_code_specialized		= specializeShader(1, &dummy_vs_code);
	const char* vs_code_specialized_raw = vs_code_specialized.c_str();

	for (glw::GLuint i = 0; i < m_number_of_gs; ++i)
	{
		if (!TestCaseBase::buildProgram(m_po_ids[i], m_fs_id, 1,				  /* n_sh1_body_parts */
										&fs_code_specialized_raw, m_gs_ids[i], 1, /* n_sh2_body_parts */
										&gs_codes_specialized_raw[i], m_vs_id, 1, /* n_sh3_body_parts */
										&vs_code_specialized_raw, &has_shader_compilation_failed))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Program object linking failed for i = "
							   << "[" << i << "]." << tcu::TestLog::EndMessage;

			result = false;
			break;
		}
	}

	if (result)
	{
		/* Create a 2D texture. */
		gl.genTextures(1, &m_texture_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

		gl.bindTexture(GL_TEXTURE_2D, m_texture_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		gl.texStorage2D(GL_TEXTURE_2D, 1 /*levels*/, GL_RGBA8, 16 /*width taken from spec*/,
						16 /*height taken from spec*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

		/* Configure FBO. */
		gl.genFramebuffers(1, &m_fbo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call failed.");

		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture_id, 0 /*level*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

		/* Configure VAO. */
		gl.genVertexArrays(1, &m_vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

		gl.bindVertexArray(m_vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

		gl.clearColor(0.0f, 1.0f, 0.0f, 0.0f);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor() call failed.");

		for (glw::GLuint po = 0; po < m_number_of_gs; ++po)
		{
			/* Use Program Object. */
			gl.useProgram(m_po_ids[po]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");

			gl.drawArrays(GL_POINTS, 0 /*first*/, 1 /*count*/);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed for GL_POINTS pname.");

			gl.readPixels(0 /*x*/, 0 /*y*/, m_texture_width, m_texture_height, GL_RGBA, GL_UNSIGNED_BYTE, m_pixels);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");

			for (glw::GLuint pixel = 0; pixel < (m_texture_width * m_texture_height * m_number_of_color_components -
												 m_number_of_color_components);
				 pixel += m_number_of_color_components)
			{
				if (m_pixels[pixel] != 0 && m_pixels[pixel + 1] != 255 && m_pixels[pixel + 2] != 0 &&
					m_pixels[pixel + 3] != 0)
				{
					result = false;

					m_testCtx.getLog() << tcu::TestLog::Message << "Pixel [" << pixel << "] has color = ["
									   << m_pixels[pixel] << ", " << m_pixels[pixel + 1] << ", " << m_pixels[pixel + 2]
									   << ", " << m_pixels[pixel + 3] << "] "
									   << "instead of [0, 255, 0, 0]." << tcu::TestLog::EndMessage;

					break;
				}
			}
		}
	}

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}